

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
::setFromSignUnbiasedExponentAndNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
           *this,bool negative,int_type exponent,uint_type significand,bool round_denorm_up)

{
  bool bVar1;
  FloatProxy<spvtools::utils::Float16> local_1c;
  ushort local_1a;
  bool local_18;
  undefined1 local_17;
  ushort local_16;
  ushort local_14;
  uint_type new_value;
  bool significand_is_zero;
  bool round_denorm_up_local;
  uint_type significand_local;
  int_type exponent_local;
  bool negative_local;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *this_local;
  
  local_16 = significand;
  if (exponent < -0xe) {
    local_16 = (ushort)((int)(uint)(significand | 0x400) >> 1);
  }
  bVar1 = exponent >= -0xe;
  local_18 = bVar1 && significand == 0;
  for (local_14 = exponent; (short)local_14 < -0xf; local_14 = local_14 + 1) {
    local_16 = (ushort)((int)(uint)local_16 >> 1);
  }
  if ((((local_14 == -0xf) && (local_16 == 0)) && (!bVar1 || significand != 0)) && (round_denorm_up)
     ) {
    local_16 = 1;
  }
  local_1a = 0;
  if (negative) {
    local_1a = 0x8000;
  }
  local_14 = local_14 + 0xf;
  local_17 = round_denorm_up;
  new_value._1_1_ = negative;
  _significand_is_zero = this;
  if ((short)local_14 < 0) {
    __assert_fail("exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                  ,0x1c9,
                  "void spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>>::setFromSignUnbiasedExponentAndNormalizedSignificand(bool, int_type, uint_type, bool) [T = spvtools::utils::FloatProxy<spvtools::utils::Float16>, Traits = spvtools::utils::HexFloatTraits<FloatProxy<Float16>>]"
                 );
  }
  local_14 = local_14 * 0x400 & 0x7c00;
  local_16 = local_16 & 0x3ff;
  local_1a = local_1a | local_14 | local_16;
  FloatProxy<spvtools::utils::Float16>::FloatProxy(&local_1c,local_1a);
  (this->value_).data_ = local_1c.data_;
  return;
}

Assistant:

void setFromSignUnbiasedExponentAndNormalizedSignificand(
      bool negative, int_type exponent, uint_type significand,
      bool round_denorm_up) {
    bool significand_is_zero = significand == 0;

    if (exponent <= min_exponent) {
      // If this was denormalized, then we have to shift the bit on, meaning
      // the significand is not zero.
      significand_is_zero = false;
      significand |= first_exponent_bit;
      significand = static_cast<uint_type>(significand >> 1);
    }

    while (exponent < min_exponent) {
      significand = static_cast<uint_type>(significand >> 1);
      ++exponent;
    }

    if (exponent == min_exponent) {
      if (significand == 0 && !significand_is_zero && round_denorm_up) {
        significand = static_cast<uint_type>(0x1);
      }
    }

    uint_type new_value = 0;
    if (negative) {
      new_value = static_cast<uint_type>(new_value | sign_mask);
    }
    exponent = static_cast<int_type>(exponent + exponent_bias);
    assert(exponent >= 0);

    // put it all together
    exponent = static_cast<uint_type>((exponent << exponent_left_shift) &
                                      exponent_mask);
    significand = static_cast<uint_type>(significand & fraction_encode_mask);
    new_value = static_cast<uint_type>(new_value | (exponent | significand));
    value_ = T(new_value);
  }